

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void uiter_setCharacterIterator_63(UCharIterator *iter,CharacterIterator *charIter)

{
  CharacterIterator *charIter_local;
  UCharIterator *iter_local;
  
  if (iter != (UCharIterator *)0x0) {
    if (charIter == (CharacterIterator *)0x0) {
      memcpy(iter,&noopIterator,0x70);
    }
    else {
      memcpy(iter,&characterIteratorWrapper,0x70);
      iter->context = charIter;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setCharacterIterator(UCharIterator *iter, CharacterIterator *charIter) {
    if(iter!=0) {
        if(charIter!=0) {
            *iter=characterIteratorWrapper;
            iter->context=charIter;
        } else {
            *iter=noopIterator;
        }
    }
}